

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O3

uint64_t __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::find_child(compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,uint64_t node_id,uint64_t symb)

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  uint32_t uVar4;
  bool bVar5;
  uint uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t cnt;
  uint64_t rhs;
  uint64_t slot_id;
  
  if (this->size_ == 0) {
    return 0xffffffffffffffff;
  }
  uVar7 = bijective_hash::split_mix_hasher::hash
                    (&this->hasher_,node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb
                    );
  uVar4 = (this->capa_size_).bits_;
  rhs = 1;
  slot_id = uVar7 & (this->capa_size_).mask_;
  do {
    if (slot_id != 0) {
      uVar1 = (this->table_).width_;
      puVar2 = (this->table_).chunks_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = uVar1 * slot_id;
      uVar10 = (ulong)((uint)uVar9 & 0x3f);
      uVar8 = puVar2[uVar9 >> 6];
      if (uVar1 + uVar10 < 0x41) {
        uVar6 = (uint)(uVar8 >> uVar10);
      }
      else {
        bVar3 = (byte)uVar9 & 0x3f;
        uVar6 = (uint)(uVar8 >> bVar3) | (uint)(puVar2[(uVar9 >> 6) + 1] << 0x40 - bVar3);
      }
      if ((uVar6 & (uint)(this->table_).mask_ & 0xf) == 0) {
        return 0xffffffffffffffff;
      }
      bVar5 = compare_dsp_(this,slot_id,rhs);
      if (bVar5) {
        uVar1 = (this->table_).width_;
        puVar2 = (this->table_).chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = uVar1 * slot_id;
        uVar10 = (ulong)((uint)uVar9 & 0x3f);
        uVar8 = puVar2[uVar9 >> 6];
        if (uVar1 + uVar10 < 0x41) {
          uVar8 = uVar8 >> uVar10;
        }
        else {
          bVar3 = (byte)uVar9 & 0x3f;
          uVar8 = uVar8 >> bVar3 | puVar2[(uVar9 >> 6) + 1] << 0x40 - bVar3;
        }
        if (uVar7 >> ((ulong)(byte)uVar4 & 0x3f) == (uVar8 & (this->table_).mask_) >> 4) {
          return slot_id;
        }
      }
    }
    slot_id = slot_id + 1 & (this->capa_size_).mask_;
    rhs = rhs + 1;
  } while( true );
}

Assistant:

uint64_t find_child(uint64_t node_id, uint64_t symb) const {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        if (size_ == 0) {
            return nil_id;
        }

        auto [quo, mod] = decompose_(hasher_.hash(make_key_(node_id, symb)));

        for (uint64_t i = mod, cnt = 1;; i = right_(i), ++cnt) {
            if (i == get_root()) {
                // because the root's dsp value is zero though it is defined
                continue;
            }

            if (compare_dsp_(i, 0)) {
                // this slot is empty
                return nil_id;
            }

            if (compare_dsp_(i, cnt) and quo == get_quo_(i)) {
                return i;
            }
        }
    }